

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int av1_handle_intra_y_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *rd_stats_y,int64_t best_rd,
              int *mode_cost_y,int64_t *rd_y,int64_t *best_model_rd,int64_t *top_intra_model_rd)

{
  uint8_t *__src;
  byte bVar1;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *mbmi_00;
  FILTER_INTRA_MODE FVar2;
  TX_SIZE tx_size;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int64_t this_model_rd;
  undefined7 in_register_00000009;
  ulong uVar8;
  FILTER_INTRA_MODE fi_mode;
  FILTER_INTRA_MODE FVar9;
  ulong uVar10;
  undefined8 uVar11;
  int mode_cost;
  RD_STATS *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  TX_SIZE local_8b1;
  long local_898;
  RD_STATS rd_stats_y_fi;
  undefined1 local_838 [1024];
  uint8_t best_blk_skip [1024];
  
  mbmi = *(x->e_mbd).mi;
  bVar1 = mbmi->mode;
  uVar10 = (ulong)bVar1;
  uVar8 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  mode_cost = ref_frame_cost + (x->mode_costs).mbmode_cost[""[uVar8]][uVar10];
  uVar3 = av1_get_skip_txfm_context(&x->e_mbd);
  iVar4 = av1_get_intra_cost_penalty
                    ((cpi->common).quant_params.base_qindex,(cpi->common).quant_params.y_dc_delta_q,
                     ((cpi->common).seq_params)->bit_depth);
  iVar5 = mode_cost;
  if ((bVar1 != 0) && (bVar1 != 0xc)) {
    iVar5 = iVar4 + mode_cost;
  }
  iVar4 = (x->mode_costs).skip_txfm_cost[uVar3][0];
  iVar6 = (x->mode_costs).skip_txfm_cost[uVar3][1];
  if (iVar4 < iVar6) {
    iVar6 = iVar4;
  }
  if ((long)x->rdmult * (long)(iVar6 + iVar5) + 0x100 >> 9 <= best_rd) {
    if (((BLOCK_8X4 < bsize) && (0xf7 < (byte)(bVar1 - 9))) &&
       ((cpi->oxcf).intra_mode_cfg.enable_angle_delta == true)) {
      lVar7 = (long)(cpi->sf).intra_sf.intra_pruning_with_hog;
      if ((lVar7 != 0) && (intra_search_state->dir_mode_skip_mask_ready == 0)) {
        prune_intra_mode_with_hog
                  (x,bsize,((cpi->common).seq_params)->sb_size,*(float *)(&DAT_00462e2c + lVar7 * 4)
                   ,intra_search_state->directional_mode_skip_mask,0);
        intra_search_state->dir_mode_skip_mask_ready = 1;
      }
      if (intra_search_state->directional_mode_skip_mask[uVar10] != '\0') {
        return 0;
      }
    }
    tx_size = '\x03';
    if (((uint)CONCAT71(in_register_00000009,bsize) & 0xfffffffc) != 0xc) {
      tx_size = ""[uVar8];
    }
    uVar11 = 1;
    this_model_rd = intra_model_rd(&cpi->common,x,0,bsize,tx_size,1);
    iVar5 = get_model_rd_index_for_pruning(x,&(cpi->sf).intra_sf);
    iVar5 = prune_intra_y_mode(this_model_rd,best_model_rd,top_intra_model_rd,
                               (cpi->sf).intra_sf.top_intra_model_count_allowed,iVar5);
    if (iVar5 != 0) {
      return 0;
    }
    rd_stats_y->rate = 0;
    rd_stats_y->zero_rate = 0;
    rd_stats_y->dist = 0;
    rd_stats_y->rdcost = 0;
    rd_stats_y->sse = 0;
    rd_stats_y->skip_txfm = '\x01';
    av1_pick_uniform_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,best_rd);
    iVar5 = (int)uVar11;
    if (uVar10 == 0) {
      iVar4 = av1_filter_intra_allowed_bsize(&cpi->common,bsize);
      iVar5 = (int)uVar11;
      if (iVar4 != 0) {
        iVar4 = rd_stats_y->rate;
        local_898 = 0x7fffffffffffffff;
        if (iVar4 == 0x7fffffff) {
          iVar5 = (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames;
          bVar15 = false;
          bVar14 = iVar5 < 0;
          bVar13 = iVar5 == 0;
        }
        else {
          (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
          iVar5 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,mode_cost,iVar5);
          local_898 = rd_stats_y->dist * 0x80 +
                      ((long)x->rdmult * (long)(iVar5 + iVar4) + 0x100 >> 9);
          lVar7 = local_898 / 2;
          bVar15 = SBORROW8(lVar7,best_rd);
          bVar14 = lVar7 - best_rd < 0;
          bVar13 = lVar7 == best_rd;
        }
        iVar5 = (int)uVar11;
        if (bVar13 || bVar15 != bVar14) {
          mbmi_00 = *(x->e_mbd).mi;
          local_8b1 = mbmi_00->tx_size;
          __src = (x->txfm_search_info).blk_skip;
          iVar5 = ctx->num_4x4_blk;
          memcpy(best_blk_skip,__src,(long)iVar5);
          memcpy(local_838,(x->e_mbd).tx_type_map,(long)iVar5);
          (mbmi_00->filter_intra_mode_info).use_filter_intra = '\x01';
          FVar2 = '\0';
          bVar13 = false;
          for (FVar9 = '\0'; iVar5 = (int)uVar11, FVar9 != '\x05'; FVar9 = FVar9 + '\x01') {
            (mbmi_00->filter_intra_mode_info).filter_intra_mode = FVar9;
            av1_pick_uniform_tx_size_type_yrd(cpi,x,&rd_stats_y_fi,bsize,best_rd);
            iVar4 = rd_stats_y_fi.rate;
            if (rd_stats_y_fi.rate != 0x7fffffff) {
              iVar6 = intra_mode_info_cost_y(cpi,x,mbmi_00,bsize,mode_cost,(int)uVar11);
              iVar5 = (int)uVar11;
              lVar7 = rd_stats_y_fi.dist * 0x80 +
                      ((long)x->rdmult * (long)(iVar6 + iVar4) + 0x100 >> 9);
              if ((lVar7 != 0x7fffffffffffffff) && (best_rd < lVar7 / 2)) break;
              if (lVar7 < local_898) {
                local_8b1 = mbmi_00->tx_size;
                iVar5 = ctx->num_4x4_blk;
                memcpy(local_838,(x->e_mbd).tx_type_map,(long)iVar5);
                memcpy(best_blk_skip,__src,(long)iVar5);
                rd_stats_y->rate = rd_stats_y_fi.rate;
                rd_stats_y->zero_rate = rd_stats_y_fi.zero_rate;
                rd_stats_y->dist = rd_stats_y_fi.dist;
                rd_stats_y->rdcost = rd_stats_y_fi.rdcost;
                rd_stats_y->sse = rd_stats_y_fi.sse;
                rd_stats_y->skip_txfm = rd_stats_y_fi.skip_txfm;
                *(undefined7 *)&rd_stats_y->field_0x21 = rd_stats_y_fi._33_7_;
                bVar13 = true;
                local_898 = lVar7;
                FVar2 = FVar9;
              }
            }
          }
          mbmi_00->tx_size = local_8b1;
          memcpy((x->e_mbd).tx_type_map,local_838,(long)ctx->num_4x4_blk);
          memcpy(__src,best_blk_skip,(long)ctx->num_4x4_blk);
          if (bVar13) {
            (mbmi_00->filter_intra_mode_info).filter_intra_mode = FVar2;
          }
          (mbmi_00->filter_intra_mode_info).use_filter_intra = bVar13;
        }
      }
    }
    if (rd_stats_y->rate == 0x7fffffff) {
      return 0;
    }
    iVar5 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,mode_cost,iVar5);
    *mode_cost_y = iVar5;
    pRVar12 = (RD_STATS *)((x->mode_costs).skip_txfm_cost[uVar3] + 1);
    if (rd_stats_y->skip_txfm == '\0') {
      pRVar12 = rd_stats_y;
    }
    lVar7 = rd_stats_y->dist * 0x80 +
            ((long)x->rdmult * ((long)iVar5 + (long)pRVar12->rate) + 0x100 >> 9);
    *rd_y = lVar7;
    if (0x3ffffffffffffffe < best_rd) {
      return 1;
    }
    if (lVar7 <= (best_rd >> 2) + best_rd) {
      return 1;
    }
  }
  intra_search_state->skip_intra_modes = 1;
  return 0;
}

Assistant:

int av1_handle_intra_y_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            const PICK_MODE_CONTEXT *ctx, RD_STATS *rd_stats_y,
                            int64_t best_rd, int *mode_cost_y, int64_t *rd_y,
                            int64_t *best_model_rd,
                            int64_t top_intra_model_rd[]) {
  const AV1_COMMON *cm = &cpi->common;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);
  const PREDICTION_MODE mode = mbmi->mode;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]][mode] + ref_frame_cost;
  const int skip_ctx = av1_get_skip_txfm_context(xd);

  int known_rate = mode_cost;
  const int intra_cost_penalty = av1_get_intra_cost_penalty(
      cm->quant_params.base_qindex, cm->quant_params.y_dc_delta_q,
      cm->seq_params->bit_depth);

  if (mode != DC_PRED && mode != PAETH_PRED) known_rate += intra_cost_penalty;
  known_rate += AOMMIN(mode_costs->skip_txfm_cost[skip_ctx][0],
                       mode_costs->skip_txfm_cost[skip_ctx][1]);
  const int64_t known_rd = RDCOST(x->rdmult, known_rate, 0);
  if (known_rd > best_rd) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  const int is_directional_mode = av1_is_directional_mode(mode);
  if (is_directional_mode && av1_use_angle_delta(bsize) &&
      cpi->oxcf.intra_mode_cfg.enable_angle_delta) {
    if (intra_sf->intra_pruning_with_hog &&
        !intra_search_state->dir_mode_skip_mask_ready) {
      const float thresh[4] = { -1.2f, 0.0f, 0.0f, 1.2f };
      const int is_chroma = 0;
      prune_intra_mode_with_hog(x, bsize, cm->seq_params->sb_size,
                                thresh[intra_sf->intra_pruning_with_hog - 1],
                                intra_search_state->directional_mode_skip_mask,
                                is_chroma);
      intra_search_state->dir_mode_skip_mask_ready = 1;
    }
    if (intra_search_state->directional_mode_skip_mask[mode]) return 0;
  }
  const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
  const int64_t this_model_rd =
      intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

  const int model_rd_index_for_pruning =
      get_model_rd_index_for_pruning(x, intra_sf);

  if (prune_intra_y_mode(this_model_rd, best_model_rd, top_intra_model_rd,
                         intra_sf->top_intra_model_count_allowed,
                         model_rd_index_for_pruning))
    return 0;
  av1_init_rd_stats(rd_stats_y);
  av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, best_rd);

  // Pick filter intra modes.
  if (mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
    int try_filter_intra = 1;
    int64_t best_rd_so_far = INT64_MAX;
    if (rd_stats_y->rate != INT_MAX) {
      // best_rd_so_far is the rdcost of DC_PRED without using filter_intra.
      // Later, in filter intra search, best_rd_so_far is used for comparison.
      mbmi->filter_intra_mode_info.use_filter_intra = 0;
      const int tmp_rate =
          rd_stats_y->rate +
          intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
      best_rd_so_far = RDCOST(x->rdmult, tmp_rate, rd_stats_y->dist);
      try_filter_intra = (best_rd_so_far / 2) <= best_rd;
    } else if (intra_sf->skip_filter_intra_in_inter_frames >= 1) {
      // As rd cost of luma intra dc mode is more than best_rd (i.e.,
      // rd_stats_y->rate = INT_MAX), skip the evaluation of filter intra modes.
      try_filter_intra = 0;
    }

    if (try_filter_intra) {
      handle_filter_intra_mode(cpi, x, bsize, ctx, rd_stats_y, mode_cost,
                               best_rd, best_rd_so_far);
    }
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  *mode_cost_y = intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
  const int rate_y = rd_stats_y->skip_txfm
                         ? mode_costs->skip_txfm_cost[skip_ctx][1]
                         : rd_stats_y->rate;
  *rd_y = RDCOST(x->rdmult, rate_y + *mode_cost_y, rd_stats_y->dist);
  if (best_rd < (INT64_MAX / 2) && *rd_y > (best_rd + (best_rd >> 2))) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  return 1;
}